

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O3

Statement * callStatement(void)

{
  Expression *pEVar1;
  Statement *pSVar2;
  undefined4 *in_RDI;
  Token TStack_28;
  
  *in_RDI = 9;
  in_RDI[2] = (head->value).line;
  pEVar1 = call();
  *(Expression **)(in_RDI + 4) = pEVar1;
  pSVar2 = (Statement *)consume(&TStack_28,TOKEN_NEWLINE,"Expected newline after routine call!");
  return pSVar2;
}

Assistant:

static Statement callStatement(){
    Statement s;
    s.type = STATEMENT_CALL;
    s.callStatement.callee = NULL;
    s.callStatement.line = presentLine();
    s.callStatement.callee = call();
    consume(TOKEN_NEWLINE, "Expected newline after routine call!");
    return s;
}